

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

uint32 Bstrlib::getUnicode(uchar **array)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  
  pbVar3 = *array;
  bVar1 = *pbVar3;
  uVar2 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) == 0) {
      iVar4 = 0;
      uVar2 = 0x7f;
    }
    else {
      uVar2 = 0x7f;
      uVar5 = 0x40;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + 1;
        uVar2 = uVar2 >> 1;
        uVar5 = uVar5 >> 1;
      } while ((uVar5 & bVar1) != 0);
    }
    uVar2 = bVar1 & uVar2;
    pbVar3 = pbVar3 + 1;
    *array = pbVar3;
    iVar4 = iVar4 + 1;
    while (((iVar4 = iVar4 + -1, 0 < iVar4 && (bVar1 = *pbVar3, bVar1 != 0)) &&
           ((bVar1 & 0xc0) == 0x80))) {
      uVar2 = uVar2 << 6 | bVar1 & 0x3f;
      pbVar3 = pbVar3 + 1;
      *array = pbVar3;
    }
  }
  else if (bVar1 != 0) {
    *array = pbVar3 + 1;
    return (uint)bVar1;
  }
  return uVar2;
}

Assistant:

uint32 getUnicode(const unsigned char * & array)
    {
        // Get the current char
        const uint8 c = *array;
        if ((c & 0x80))
        {
            // The data is in the 7 low bits
            uint32 dataMask = 0x7f;
            // The count bit mask
            uint32 bitCountMask = 0x40;
            // The consumption count
            int charCount = 0;

            while ((c & bitCountMask) != 0 && bitCountMask)
            {
                ++charCount;
                dataMask >>= 1; bitCountMask >>= 1;
            }

            // Get the few bits remaining here
            uint32 n = (c & dataMask);

            // Then extract the remaining bits
            ++array;
            while (--charCount >= 0 && *array)
            {
                const uint8 extra = *array;
                // Make sure it's a valid UTF8 encoding
                if ((extra & 0xc0) != 0x80) break;

                // Store the new bits too
                n <<= 6; n |= (extra & 0x3f);
                ++array;
            }
            return n;
        }
        if (c) ++array;
        return c;
    }